

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O3

bool __thiscall ON_SubDHeap::GrowFaceEdgeArray(ON_SubDHeap *this,ON_SubDFace *f,size_t capacity)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ON_3dPoint *point_array;
  undefined8 uVar3;
  double dVar4;
  uint uVar5;
  ON_SubDEdgePtr *pOVar6;
  ON_3dPoint *pOVar7;
  ON_3dPoint *pOVar8;
  long lVar9;
  bool bVar10;
  size_t sVar11;
  ulong uVar12;
  size_t xcapacity;
  size_t local_38;
  
  if (f == (ON_SubDFace *)0x0) {
    ON_SubDIncrementErrorCount();
    bVar10 = false;
  }
  else {
    uVar5 = ON_SubDFace::TexturePointsCapacity(f);
    if (capacity == 0) {
      capacity = (ulong)f->m_edge_count + 1;
    }
    bVar10 = true;
    if ((ulong)f->m_edgex_capacity + 4 < capacity) {
      local_38 = capacity - 4;
      sVar11 = 0;
      if (4 < f->m_edge_count) {
        sVar11 = (ulong)(f->m_edge_count - 4);
      }
      pOVar6 = (ON_SubDEdgePtr *)
               ResizeArray(this,sVar11,(ulong)f->m_edgex_capacity,&f->m_edgex->m_ptr,&local_38);
      sVar11 = local_38;
      bVar10 = pOVar6 != (ON_SubDEdgePtr *)0x0;
      if (pOVar6 == (ON_SubDEdgePtr *)0x0) {
        f->m_edge_count = 0;
        f->m_edgex_capacity = 0;
        f->m_edgex = (ON_SubDEdgePtr *)0x0;
        f->m_texture_points = (ON_3dPoint *)0x0;
        f->m_texture_status_bits = f->m_texture_status_bits & 0xfe;
        ON_SubDIncrementErrorCount();
      }
      else {
        uVar12 = (ulong)uVar5;
        f->m_edgex = pOVar6;
        f->m_edgex_capacity = (unsigned_short)local_38;
        if ((uVar12 != 0) && (uVar12 < local_38 + 4)) {
          point_array = f->m_texture_points;
          pOVar7 = Allocate3dPointArray(this,local_38 + 4);
          lVar9 = 0;
          do {
            *(undefined8 *)((long)&pOVar7->z + lVar9) =
                 *(undefined8 *)((long)&point_array->z + lVar9);
            puVar1 = (undefined8 *)((long)&point_array->x + lVar9);
            uVar3 = puVar1[1];
            puVar2 = (undefined8 *)((long)&pOVar7->x + lVar9);
            *puVar2 = *puVar1;
            puVar2[1] = uVar3;
            lVar9 = lVar9 + 0x18;
          } while (uVar12 * 0x18 != lVar9);
          lVar9 = (sVar11 - uVar12) + 4;
          pOVar8 = pOVar7 + uVar12;
          do {
            pOVar8->z = ON_3dPoint::NanPoint.z;
            dVar4 = ON_3dPoint::NanPoint.y;
            pOVar8->x = ON_3dPoint::NanPoint.x;
            pOVar8->y = dVar4;
            pOVar8 = pOVar8 + 1;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
          f->m_texture_points = pOVar7;
          Return3dPointArray(this,point_array);
        }
      }
    }
  }
  return bVar10;
}

Assistant:

bool ON_SubDHeap::GrowFaceEdgeArray(
  ON_SubDFace* f,
  size_t capacity
  )
{
  if ( nullptr == f)
    return ON_SUBD_RETURN_ERROR(false);

  // The capacity of f->m_texture_points[] must always be 4 + f->m_edgex_capacity
  const size_t texture_point_capacity0 = f->TexturePointsCapacity();

  if ( 0 == capacity )
    capacity = f->m_edge_count+1;
  if ( capacity <= (size_t)(4 + f->m_edgex_capacity))
    return true;
  size_t xcapacity = capacity-4;
  ON__UINT_PTR* a = ResizeArray((f->m_edge_count>4) ? (f->m_edge_count-4) : 0,f->m_edgex_capacity,(ON__UINT_PTR*)f->m_edgex,&xcapacity);
  if ( nullptr == a )
  {
    f->m_edge_count = 0;
    f->m_edgex_capacity = 0;
    f->m_edgex = nullptr;
    // also remove texture points
    f->m_texture_status_bits &= ON_SubDFace::TextureStatusBits::NotTexturePointsBitsMask;
    f->m_texture_points = nullptr;
    return ON_SUBD_RETURN_ERROR(false);
  }
  f->m_edgex = (ON_SubDEdgePtr*)a;
  f->m_edgex_capacity = (unsigned short)xcapacity;
  if (texture_point_capacity0 > 0)
  {
    const size_t texture_point_capacity1 = 4 + xcapacity;
    if (texture_point_capacity0 < texture_point_capacity1)
    {
      ON_3dPoint* texture_points0 = f->m_texture_points;
      ON_3dPoint* texture_points1 = this->Allocate3dPointArray(texture_point_capacity1);
      for (size_t i = 0; i < texture_point_capacity0; ++i)
        texture_points1[i] = texture_points0[i];
      for (size_t i = texture_point_capacity0; i < texture_point_capacity1; ++i)
        texture_points1[i] = ON_3dPoint::NanPoint;
      f->m_texture_points = texture_points1;
      this->Return3dPointArray(texture_points0);
    }
  }
  return true;
}